

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u8 tabOpts,Select *pSelect)

{
  byte *pbVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  int iVar5;
  Table *pTab;
  sqlite3 *db;
  Column *pCVar6;
  LogEst LVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  Vdbe *pVVar11;
  Parse *pPVar12;
  Token *pTVar13;
  Table *pTable;
  size_t sVar14;
  Expr *pExpr;
  ExprList *pList;
  int iVar15;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  Op *pOVar19;
  Schema **ppSVar20;
  u8 *puVar21;
  char *pcVar22;
  long lVar23;
  uint uVar24;
  short *psVar25;
  short *psVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  Index *pIVar30;
  bool bVar31;
  char cVar32;
  SelectDest dest;
  
  if (pEnd == (Token *)0x0 && pSelect == (Select *)0x0) {
    return;
  }
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) {
    return;
  }
  db = pParse->db;
  if (((db->init).busy != '\0') && (iVar15 = (db->init).newTnum, pTab->tnum = iVar15, iVar15 == 1))
  {
    *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 1;
  }
  if ((tabOpts & 0x20) != 0) {
    uVar17 = pTab->tabFlags;
    if ((uVar17 & 8) != 0) {
      sqlite3ErrorMsg(pParse,"AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if ((uVar17 & 4) == 0) {
      sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
    }
    else {
      pTab->tabFlags = uVar17 | 0x60;
      pVVar11 = pParse->pVdbe;
      if (((db->init).imposterTable == '\0') && (sVar3 = pTab->nCol, 0 < (long)sVar3)) {
        pCVar6 = pTab->aCol;
        lVar23 = 0;
        do {
          if (((&pCVar6->colFlags)[lVar23] & 1) != 0) {
            (&pCVar6->notNull)[lVar23] = '\x02';
          }
          lVar23 = lVar23 + 0x20;
        } while ((long)sVar3 * 0x20 != lVar23);
      }
      if (pParse->declareVtab == '\0') {
        iVar15 = pParse->addrCrTab;
        if (iVar15 != 0) {
          if (iVar15 < 0) {
            iVar15 = pVVar11->nOp + -1;
          }
          if (pVVar11->db->mallocFailed == '\0') {
            pOVar19 = pVVar11->aOp + iVar15;
          }
          else {
            pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar19->opcode = 0x86;
        }
        if ((long)pTab->iPKey < 0) {
          for (pPVar12 = (Parse *)pTab->pIndex;
              (pPVar12 != (Parse *)0x0 && (((ulong)pPVar12->pConstExpr & 0x3000000) != 0x2000000));
              pPVar12 = *(Parse **)&pPVar12->nRangeReg) {
          }
          iVar15 = 1;
          if (1 < *(u16 *)((long)&pPVar12->aLabel + 6)) {
            psVar25 = (short *)pPVar12->zErrMsg;
            iVar15 = 1;
            uVar29 = 1;
            do {
              psVar26 = psVar25;
              iVar8 = iVar15;
              do {
                iVar9 = iVar8;
                if (iVar9 < 1) goto LAB_00225a86;
                sVar3 = *psVar26;
                psVar26 = psVar26 + 1;
                iVar8 = iVar9 + -1;
              } while (sVar3 != psVar25[uVar29]);
              if (iVar9 < 1) {
LAB_00225a86:
                lVar23 = (long)iVar15;
                iVar15 = iVar15 + 1;
                psVar25[lVar23] = psVar25[uVar29];
              }
              else {
                *(u16 *)&pPVar12->pConstExpr = *(u16 *)&pPVar12->pConstExpr - 1;
              }
              uVar29 = uVar29 + 1;
            } while (uVar29 < *(u16 *)((long)&pPVar12->aLabel + 6));
          }
          *(u16 *)((long)&pPVar12->aLabel + 6) = (u16)iVar15;
        }
        else {
          dest._0_8_ = pTab->aCol[pTab->iPKey].zName;
          if ((char *)dest._0_8_ == (char *)0x0) {
            uVar17 = 0;
          }
          else {
            sVar14 = strlen((char *)dest._0_8_);
            uVar17 = (uint)sVar14 & 0x3fffffff;
          }
          dest.iSdst = uVar17;
          bVar31 = false;
          pExpr = sqlite3ExprAlloc(db,0x1b,(Token *)&dest,0);
          pList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
          pPVar12 = pParse;
          if (pList != (ExprList *)0x0) {
            pList->a[0].sortOrder = pParse->iPkSortOrder;
            sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,
                               (uint)pTab->keyConf,(Token *)0x0,(Expr *)0x0,0,0,'\x02');
            if (db->mallocFailed == '\0') {
              for (pPVar12 = (Parse *)pTab->pIndex;
                  (pPVar12 != (Parse *)0x0 &&
                  (((ulong)pPVar12->pConstExpr & 0x3000000) != 0x2000000));
                  pPVar12 = *(Parse **)&pPVar12->nRangeReg) {
              }
              pTab->iPKey = -1;
              bVar31 = true;
            }
          }
          if (!bVar31) goto LAB_002254bf;
        }
        bVar2 = *(byte *)((long)&pPVar12->pConstExpr + 3);
        *(byte *)((long)&pPVar12->pConstExpr + 3) = bVar2 | 0x20;
        if ((db->init).imposterTable == '\0') {
          *(byte *)((long)&pPVar12->pConstExpr + 3) = bVar2 | 0x28;
        }
        uVar4 = *(ushort *)((long)&pPVar12->aLabel + 6);
        uVar29 = (ulong)uVar4;
        if ((pVVar11 != (Vdbe *)0x0) && (0 < (long)*(int *)&pPVar12->aLabel)) {
          if (pVVar11->db->mallocFailed == '\0') {
            pOVar19 = pVVar11->aOp + *(int *)&pPVar12->aLabel;
          }
          else {
            pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar19->opcode = '\r';
        }
        *(int *)&pPVar12->aLabel = pTab->tnum;
        for (pIVar30 = pTab->pIndex; pIVar30 != (Index *)0x0; pIVar30 = pIVar30->pNext) {
          cVar32 = '\n';
          if ((pIVar30->field_0x63 & 3) != 2) {
            if (uVar29 == 0) {
              iVar15 = 0;
            }
            else {
              uVar27 = 0;
              iVar15 = 0;
              do {
                psVar25 = pIVar30->aiColumn;
                uVar17 = (uint)pIVar30->nKeyCol;
                do {
                  uVar24 = uVar17;
                  if ((int)uVar24 < 1) break;
                  sVar3 = *psVar25;
                  psVar25 = psVar25 + 1;
                  uVar17 = uVar24 - 1;
                } while (sVar3 != *(short *)(pPVar12->zErrMsg + uVar27 * 2));
                iVar15 = iVar15 + (uint)((int)uVar24 < 1);
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar29);
            }
            if (iVar15 == 0) {
              pIVar30->nColumn = pIVar30->nKeyCol;
            }
            else {
              iVar15 = resizeIndexObject(db,pIVar30,iVar15 + (uint)pIVar30->nKeyCol);
              cVar32 = iVar15 != 0;
              if ((!(bool)cVar32) && (uVar4 != 0)) {
                uVar17 = (uint)pIVar30->nKeyCol;
                uVar27 = 0;
                do {
                  psVar25 = pIVar30->aiColumn;
                  uVar24 = (uint)pIVar30->nKeyCol;
                  do {
                    uVar28 = uVar24;
                    if ((int)uVar28 < 1) goto LAB_00225ddc;
                    sVar3 = *psVar25;
                    psVar25 = psVar25 + 1;
                    uVar24 = uVar28 - 1;
                  } while (sVar3 != *(short *)(pPVar12->zErrMsg + uVar27 * 2));
                  if ((int)uVar28 < 1) {
LAB_00225ddc:
                    pIVar30->aiColumn[(int)uVar17] = *(short *)(pPVar12->zErrMsg + uVar27 * 2);
                    pIVar30->azColl[(int)uVar17] =
                         *(char **)(*(long *)&pPVar12->szOpAlloc + uVar27 * 8);
                    uVar17 = uVar17 + 1;
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar27 != uVar29);
                cVar32 = '\0';
              }
            }
          }
          if ((cVar32 != '\n') && (cVar32 != '\0')) goto LAB_002254bf;
        }
        sVar3 = pTab->nCol;
        if ((int)(uint)uVar4 < (int)sVar3) {
          iVar15 = resizeIndexObject(db,(Index *)pPVar12,(int)sVar3);
          if ((iVar15 == 0) && (0 < pTab->nCol)) {
            iVar15 = 0;
            do {
              iVar8 = (int)uVar29;
              psVar25 = (short *)pPVar12->zErrMsg;
              uVar27 = uVar29;
              do {
                iVar9 = (int)uVar27;
                if (iVar9 < 1) goto LAB_00225e87;
                uVar27 = (ulong)(iVar9 - 1);
                sVar3 = *psVar25;
                psVar25 = psVar25 + 1;
              } while (iVar15 != sVar3);
              if (iVar9 < 1) {
LAB_00225e87:
                *(short *)((long)pPVar12->zErrMsg + (long)iVar8 * 2) = (short)iVar15;
                *(char **)(*(long *)&pPVar12->szOpAlloc + (long)iVar8 * 8) = "BINARY";
                uVar29 = (ulong)(iVar8 + 1);
              }
              iVar15 = iVar15 + 1;
            } while (iVar15 < pTab->nCol);
          }
        }
        else {
          *(short *)&pPVar12->pConstExpr = sVar3;
        }
      }
    }
  }
LAB_002254bf:
  if (pTab->pSchema == (Schema *)0x0) {
    uVar29 = 0xfff0bdc0;
  }
  else {
    uVar17 = db->nDb;
    if ((int)uVar17 < 1) {
      uVar29 = 0;
    }
    else {
      ppSVar20 = &db->aDb->pSchema;
      uVar29 = 0;
      do {
        if (*ppSVar20 == pTab->pSchema) goto LAB_00225561;
        uVar29 = uVar29 + 1;
        ppSVar20 = ppSVar20 + 4;
      } while (uVar17 != uVar29);
      uVar29 = (ulong)uVar17;
    }
  }
LAB_00225561:
  if (pTab->pCheck != (ExprList *)0x0) {
    sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck);
  }
  if (pTab->nCol < 1) {
    iVar15 = 0;
  }
  else {
    iVar8 = pTab->nCol + 1;
    puVar21 = &pTab->aCol->szEst;
    iVar15 = 0;
    do {
      iVar15 = iVar15 + (uint)*puVar21;
      iVar8 = iVar8 + -1;
      puVar21 = puVar21 + 0x20;
    } while (1 < iVar8);
  }
  LVar7 = sqlite3LogEst((ulong)(((uint)((ushort)pTab->iPKey >> 0xf) + iVar15) * 4));
  pTab->szTabRow = LVar7;
  for (pIVar30 = pTab->pIndex; pIVar30 != (Index *)0x0; pIVar30 = pIVar30->pNext) {
    estimateIndexWidth(pIVar30);
  }
  if ((db->init).busy == '\0') {
    pVVar11 = pParse->pVdbe;
    if (pVVar11 == (Vdbe *)0x0) {
      pVVar11 = allocVdbe(pParse);
    }
    if (pVVar11 == (Vdbe *)0x0) {
      return;
    }
    sqlite3VdbeAddOp3(pVVar11,0x70,0,0,0);
    bVar31 = pTab->pSelect == (Select *)0x0;
    pcVar22 = "VIEW";
    if (bVar31) {
      pcVar22 = "TABLE";
    }
    pcVar18 = "view";
    if (bVar31) {
      pcVar18 = "table";
    }
    iVar15 = (int)uVar29;
    if (pSelect == (Select *)0x0) {
      pTVar13 = &pParse->sLastToken;
      if (tabOpts == '\0') {
        pTVar13 = pEnd;
      }
      uVar17 = (int)pTVar13->z - (int)(pParse->sNameToken).z;
      if (*pTVar13->z != ';') {
        uVar17 = uVar17 + pTVar13->n;
      }
      pcVar22 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar22,(ulong)uVar17);
    }
    else {
      iVar8 = pParse->nMem;
      iVar16 = iVar8 + 1;
      iVar9 = iVar8 + 3;
      pParse->nMem = iVar9;
      pPVar12 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar12 = pParse;
      }
      pPVar12->mayAbort = '\x01';
      sqlite3VdbeAddOp3(pVVar11,0x69,1,pParse->regRoot,iVar15);
      iVar5 = pVVar11->nOp;
      if (0 < (long)iVar5) {
        pVVar11->aOp[(long)iVar5 + -1].p5 = 0x10;
      }
      pParse->nTab = 2;
      sqlite3VdbeAddOp3(pVVar11,0xf,iVar16,0,iVar5 + 1);
      dest.eDest = '\r';
      dest.iSDParm = iVar16;
      dest.iSdst = 0;
      dest.nSdst = 0;
      dest.zAffSdst = (char *)0x0;
      sqlite3Select(pParse,pSelect,&dest);
      sqlite3VdbeAddOp3(pVVar11,0x35,iVar16,0,0);
      pPVar12 = pVVar11->pParse;
      pPVar12->nTempReg = '\0';
      pPVar12->nRangeReg = 0;
      if (pVVar11->db->mallocFailed == '\0') {
        iVar16 = pVVar11->nOp + -1;
        if (-1 < iVar5) {
          iVar16 = iVar5;
        }
        pOVar19 = pVVar11->aOp + iVar16;
      }
      else {
        pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar19->p2 = pVVar11->nOp;
      if (pParse->nErr != 0) {
        return;
      }
      pTable = sqlite3ResultSetOfSelect(pParse,pSelect);
      if (pTable == (Table *)0x0) {
        return;
      }
      pTab->nCol = pTable->nCol;
      pTab->aCol = pTable->aCol;
      pTable->nCol = 0;
      pTable->aCol = (Column *)0x0;
      sqlite3DeleteTable(db,pTable);
      iVar16 = sqlite3VdbeAddOp3(pVVar11,0x10,dest.iSDParm,0,0);
      sqlite3VdbeAddOp3(pVVar11,99,dest.iSdst,dest.nSdst,iVar8 + 2);
      sqlite3TableAffinity(pVVar11,pTab,0);
      sqlite3VdbeAddOp3(pVVar11,0x73,1,iVar9,0);
      sqlite3VdbeAddOp3(pVVar11,0x74,1,iVar8 + 2,iVar9);
      sqlite3VdbeAddOp3(pVVar11,0xd,0,iVar16,0);
      if (pVVar11->db->mallocFailed == '\0') {
        iVar8 = pVVar11->nOp + -1;
        if (-1 < iVar16) {
          iVar8 = iVar16;
        }
        pOVar19 = pVVar11->aOp + iVar8;
      }
      else {
        pOVar19 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar19->p2 = pVVar11->nOp;
      sqlite3VdbeAddOp3(pVVar11,0x70,1,0,0);
      pcVar22 = createTableStmt(db,pTab);
    }
    sqlite3NestedParse(pParse,
                       "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                       ,db->aDb[iVar15].zDbSName,"sqlite_master",pcVar18,pTab->zName,pTab->zName,
                       (ulong)(uint)pParse->regRoot,pcVar22,(ulong)(uint)pParse->regRowid);
    if (pcVar22 != (char *)0x0) {
      sqlite3DbFreeNN(db,pcVar22);
    }
    sqlite3VdbeAddOp3(pParse->pVdbe,0x66,iVar15,1,
                      (pParse->db->aDb[iVar15].pSchema)->schema_cookie + 1);
    if (((pTab->tabFlags & 8) != 0) && ((db->aDb[iVar15].pSchema)->pSeqTab == (Table *)0x0)) {
      sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar15].zDbSName
                        );
    }
    pcVar22 = sqlite3MPrintf(db,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
    sqlite3VdbeAddParseSchemaOp(pVVar11,iVar15,pcVar22);
  }
  if ((db->init).busy != '\0') {
    pvVar10 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
    if (pvVar10 == (void *)0x0) {
      pParse->pNewTable = (Table *)0x0;
      pbVar1 = (byte *)((long)&db->flags + 2);
      *pbVar1 = *pbVar1 | 0x80;
      if (pTab->pSelect == (Select *)0x0) {
        pcVar22 = (pParse->sNameToken).z;
        if (pCons->z != (char *)0x0) {
          pEnd = pCons;
        }
        iVar15 = sqlite3Utf8CharLen(pcVar22,*(int *)&pEnd->z - (int)pcVar22);
        pTab->addColOffset = iVar15 + 0xd;
      }
    }
    else if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
      db->mallocFailed = '\x01';
      if (0 < db->nVdbeExec) {
        (db->u1).isInterrupted = 1;
      }
      (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u8 tabOpts,             /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  assert( !db->mallocFailed );
  p = pParse->pNewTable;
  if( p==0 ) return;

  assert( !db->init.busy || !pSelect );

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_master
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
    }else{
      p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
      convertToWithoutRowidTable(pParse, p);
    }
  }

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */

      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      assert(pParse->nTab==1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, 1, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, 1, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName, MASTER_NAME,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->flags |= SQLITE_InternChanges;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}